

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printJPG(JPG *jpg)

{
  uint uVar1;
  MCU *pMVar2;
  Block *paiVar3;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  Block **ppaiVar7;
  pointer pSVar8;
  __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_> local_b8;
  __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_> local_b0;
  const_iterator it_3;
  uint i_4;
  __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_> local_98;
  __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_> local_90;
  const_iterator it_2;
  uint i_3;
  __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_> local_78;
  __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_> local_70;
  const_iterator it_1;
  uint i_2;
  __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_> local_58;
  __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_> local_50;
  const_iterator it;
  uint local_40;
  uint i_1;
  uint q;
  uint k;
  Block *block;
  uint jj;
  uint ii;
  MCU *mcu;
  uint local_18;
  uint j;
  uint i;
  uint componentID;
  JPG *jpg_local;
  
  poVar6 = std::operator<<((ostream *)&std::cout,"width:");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,jpg->width);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"height:");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,jpg->height);
  std::operator<<(poVar6,"\n");
  for (j = 1; j < 4; j = j + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"ComponentID:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,j);
    std::operator<<(poVar6,"\n");
    for (local_18 = 0; local_18 < jpg->mcuHeight; local_18 = local_18 + 1) {
      for (mcu._4_4_ = 0; mcu._4_4_ < jpg->mcuWidth; mcu._4_4_ = mcu._4_4_ + 1) {
        pMVar2 = jpg->data;
        uVar1 = jpg->mcuWidth;
        poVar6 = std::operator<<((ostream *)&std::cout,"muc Row:");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
        poVar6 = std::operator<<(poVar6," mcu column:");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,mcu._4_4_);
        std::operator<<(poVar6,"\n");
        block._4_4_ = 0;
        while( true ) {
          uVar5 = JPG::getVerticalSamplingFrequency(jpg,j);
          if (uVar5 <= block._4_4_) break;
          block._0_4_ = 0;
          while( true ) {
            uVar5 = JPG::getHorizontalSamplingFrequency(jpg,j);
            if (uVar5 <= (uint)block) break;
            poVar6 = std::operator<<((ostream *)&std::cout,"Block row:");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,block._4_4_);
            poVar6 = std::operator<<(poVar6," Block column:");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)block);
            std::operator<<(poVar6,"\n");
            ppaiVar7 = MCU::operator[](pMVar2 + (local_18 * uVar1 + mcu._4_4_),j);
            paiVar3 = *ppaiVar7;
            uVar5 = JPG::getHorizontalSamplingFrequency(jpg,j);
            for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
              for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
                poVar6 = (ostream *)
                         std::ostream::operator<<
                                   (&std::cout,
                                    paiVar3[block._4_4_ * uVar5 + (uint)block][i_1 * 8 + local_40]);
                std::operator<<(poVar6," ");
              }
              std::operator<<((ostream *)&std::cout,"\n");
            }
            block._0_4_ = (uint)block + 1;
          }
          block._4_4_ = block._4_4_ + 1;
        }
      }
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"DC Tables 0 ");
  std::operator<<(poVar6,"\n");
  for (it._M_current._4_4_ = 1; it._M_current._4_4_ < 0x11;
      it._M_current._4_4_ = it._M_current._4_4_ + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"length:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,it._M_current._4_4_);
    std::operator<<(poVar6,":::");
    local_50._M_current =
         (Symbol *)
         std::vector<Symbol,_std::allocator<Symbol>_>::cbegin
                   ((vector<Symbol,_std::allocator<Symbol>_> *)jpg);
    while( true ) {
      local_58._M_current =
           (Symbol *)
           std::vector<Symbol,_std::allocator<Symbol>_>::cend
                     ((vector<Symbol,_std::allocator<Symbol>_> *)jpg);
      bVar4 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar4) break;
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
               operator->(&local_50);
      if (pSVar8->codeLength == it._M_current._4_4_) {
        pSVar8 = __gnu_cxx::
                 __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
                 operator->(&local_50);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(uint)pSVar8->symbol);
        std::operator<<(poVar6,"  ");
      }
      __gnu_cxx::__normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
      operator++(&local_50,0);
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"DC Tables 1 ");
  std::operator<<(poVar6,"\n");
  for (it_1._M_current._4_4_ = 1; it_1._M_current._4_4_ < 0x11;
      it_1._M_current._4_4_ = it_1._M_current._4_4_ + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"length:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,it_1._M_current._4_4_);
    std::operator<<(poVar6,":::");
    local_70._M_current =
         (Symbol *)
         std::vector<Symbol,_std::allocator<Symbol>_>::cbegin(&(jpg->chromaDC).sortedSymbol);
    while( true ) {
      local_78._M_current =
           (Symbol *)
           std::vector<Symbol,_std::allocator<Symbol>_>::cend(&(jpg->chromaDC).sortedSymbol);
      bVar4 = __gnu_cxx::operator!=(&local_70,&local_78);
      if (!bVar4) break;
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
               operator->(&local_70);
      if (pSVar8->codeLength == it_1._M_current._4_4_) {
        pSVar8 = __gnu_cxx::
                 __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
                 operator->(&local_70);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(uint)pSVar8->symbol);
        std::operator<<(poVar6,"  ");
      }
      __gnu_cxx::__normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
      operator++(&local_70,0);
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"AC Tables 0 ");
  std::operator<<(poVar6,"\n");
  for (it_2._M_current._4_4_ = 1; it_2._M_current._4_4_ < 0x11;
      it_2._M_current._4_4_ = it_2._M_current._4_4_ + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"length:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,it_2._M_current._4_4_);
    std::operator<<(poVar6,":::");
    local_90._M_current =
         (Symbol *)std::vector<Symbol,_std::allocator<Symbol>_>::cbegin(&(jpg->yAC).sortedSymbol);
    while( true ) {
      local_98._M_current =
           (Symbol *)std::vector<Symbol,_std::allocator<Symbol>_>::cend(&(jpg->yAC).sortedSymbol);
      bVar4 = __gnu_cxx::operator!=(&local_90,&local_98);
      if (!bVar4) break;
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
               operator->(&local_90);
      if (pSVar8->codeLength == it_2._M_current._4_4_) {
        pSVar8 = __gnu_cxx::
                 __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
                 operator->(&local_90);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(uint)pSVar8->symbol);
        std::operator<<(poVar6,"  ");
      }
      __gnu_cxx::__normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
      operator++(&local_90,0);
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"AC Tables 1 ");
  std::operator<<(poVar6,"\n");
  for (it_3._M_current._4_4_ = 1; it_3._M_current._4_4_ < 0x11;
      it_3._M_current._4_4_ = it_3._M_current._4_4_ + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"length:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,it_3._M_current._4_4_);
    std::operator<<(poVar6,":::");
    local_b0._M_current =
         (Symbol *)
         std::vector<Symbol,_std::allocator<Symbol>_>::cbegin(&(jpg->chromaAC).sortedSymbol);
    while( true ) {
      local_b8._M_current =
           (Symbol *)
           std::vector<Symbol,_std::allocator<Symbol>_>::cend(&(jpg->chromaAC).sortedSymbol);
      bVar4 = __gnu_cxx::operator!=(&local_b0,&local_b8);
      if (!bVar4) break;
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
               operator->(&local_b0);
      if (pSVar8->codeLength == it_3._M_current._4_4_) {
        pSVar8 = __gnu_cxx::
                 __normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
                 operator->(&local_b0);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(uint)pSVar8->symbol);
        std::operator<<(poVar6,"  ");
      }
      __gnu_cxx::__normal_iterator<const_Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
      operator++(&local_b0,0);
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  return;
}

Assistant:

void printJPG(const JPG& jpg) {
    std::cout << "width:" << jpg.width << " " << "height:" << jpg.height << "\n";
    for (uint componentID = 1; componentID <= 3; componentID++) {
        std::cout << "ComponentID:" << componentID << "\n";
        for (uint i = 0; i < jpg.mcuHeight; i++) {
            for (uint j = 0; j < jpg.mcuWidth; j++) {
                MCU& mcu = jpg.data[i * jpg.mcuWidth + j];
                std::cout << "muc Row:" << i << " mcu column:" << j << "\n";
                for (uint ii = 0; ii < jpg.getVerticalSamplingFrequency(componentID); ii++) {
                    for (uint jj = 0; jj < jpg.getHorizontalSamplingFrequency(componentID); jj++) {
                        std::cout << "Block row:" << ii << " Block column:" << jj << "\n";
                        Block& block = mcu[componentID][ii * jpg.getHorizontalSamplingFrequency(componentID) + jj];
                        for(uint k = 0; k < 8; k++) {
                            for(uint q = 0; q < 8; q++) {
                                std::cout << block[k * 8 + q] << " ";
                            }
                            std::cout << "\n";
                        }
                    }
                }
            }
        }
    }
    std::cout << "DC Tables 0 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.yDC.sortedSymbol.cbegin(); it != jpg.yDC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
    std::cout << "DC Tables 1 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.chromaDC.sortedSymbol.cbegin(); it != jpg.chromaDC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";

    }
    std::cout << "AC Tables 0 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.yAC.sortedSymbol.cbegin(); it != jpg.yAC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
    std::cout << "AC Tables 1 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.chromaAC.sortedSymbol.cbegin(); it != jpg.chromaAC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
}